

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall CP::list<int>::check_pointer(list<int> *this)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  node *p;
  vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> ptr;
  set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  s;
  node *local_78;
  vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> local_70;
  _Rb_tree<CP::list<int>::node_*,_CP::list<int>::node_*,_std::_Identity<CP::list<int>::node_*>,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  local_58;
  
  std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::vector
            (&local_70,this->mSize + 1,(allocator_type *)&local_58);
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = this->mHeader;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->mSize == 0xffffffffffffffff) {
    uVar1 = 0xffffffffffffffff;
  }
  else {
    uVar3 = 0;
    do {
      std::
      _Rb_tree<CP::list<int>::node*,CP::list<int>::node*,std::_Identity<CP::list<int>::node*>,std::less<CP::list<int>::node*>,std::allocator<CP::list<int>::node*>>
      ::_M_insert_unique<CP::list<int>::node*const&>
                ((_Rb_tree<CP::list<int>::node*,CP::list<int>::node*,std::_Identity<CP::list<int>::node*>,std::less<CP::list<int>::node*>,std::allocator<CP::list<int>::node*>>
                  *)&local_58,&local_78);
      local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = local_78;
      local_78 = local_78->next;
      uVar3 = uVar3 + 1;
      uVar1 = this->mSize;
    } while (uVar3 < uVar1 + 1);
    if (local_58._M_impl.super__Rb_tree_header._M_node_count < uVar1 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR: loop detected",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      uVar1 = this->mSize;
    }
    if (uVar1 == 0) goto LAB_001015e6;
  }
  uVar3 = 0;
  do {
    if (local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3]->next !=
        local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3 + 1]) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR: next pointer broken at position ",0x27);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar1 = this->mSize;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 < uVar1);
  if (uVar1 != 0) {
    uVar3 = 1;
    do {
      if (local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3]->prev !=
          local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3 - 1]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: prev pointer broken at position ",0x27);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        uVar1 = this->mSize;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= uVar1);
  }
LAB_001015e6:
  std::
  _Rb_tree<CP::list<int>::node_*,_CP::list<int>::node_*,_std::_Identity<CP::list<int>::node_*>,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  ::~_Rb_tree(&local_58);
  if (local_70.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void check_pointer() {
      std::vector<node*> ptr(mSize+1);
      std::set<node*> s;
      node* p = mHeader;
      for (size_t i = 0;i < mSize+1;i++) {
        s.insert(p);
        ptr[i] = p;
        p = p->next;
      }

      if (s.size() < mSize+1) {
        std::cout << "ERROR: loop detected" << std::endl;
      }

      //check forward
      for (size_t i = 0;i < mSize;i++) {
        if (ptr[i]->next != ptr[i+1]) {
          std::cout << "ERROR: next pointer broken at position " << i << std::endl;
        }
      }

      //check backward
      for (size_t i = 1;i <= mSize;i++) {
        if (ptr[i]->prev != ptr[i-1]) {
          std::cout << "ERROR: prev pointer broken at position " << i << std::endl;
        }
      }
    }